

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

bool __thiscall absl::time_internal::cctz::TimeZoneInfo::ExtendTransitions(TimeZoneInfo *this)

{
  pointer *ppTVar1;
  byte bVar2;
  pointer pTVar3;
  iterator iVar4;
  long lVar5;
  pointer pTVar6;
  int_least64_t iVar7;
  int_least64_t iVar8;
  int_least8_t iVar9;
  int_least8_t iVar10;
  int_least8_t iVar11;
  int_least8_t iVar12;
  int_least8_t iVar13;
  undefined3 uVar14;
  int_least8_t iVar15;
  int_least8_t iVar16;
  int_least8_t iVar17;
  int_least8_t iVar18;
  int_least8_t iVar19;
  undefined3 uVar20;
  uint_least8_t uVar21;
  undefined7 uVar22;
  long lVar23;
  bool bVar24;
  undefined1 uVar25;
  undefined7 extraout_var;
  long lVar26;
  diff_t dVar27;
  int_fast64_t iVar28;
  int_fast64_t iVar29;
  long lVar30;
  Transition *__args;
  ulong uVar31;
  ulong uVar32;
  int jan1_weekday;
  Transition *__args_00;
  uint_least8_t std_ti;
  uint_least8_t dst_ti;
  Transition dst;
  PosixTimeZone posix;
  Transition std;
  byte local_12e;
  uint_least8_t local_12d;
  undefined4 local_12c;
  vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
  *local_128;
  int_fast64_t local_120;
  long local_118;
  Transition local_110;
  PosixTimeZone local_e0;
  Transition local_60;
  
  this->extended_ = false;
  if ((this->future_spec_)._M_string_length == 0) {
    return true;
  }
  local_e0.std_abbr._M_dataplus._M_p = (pointer)&local_e0.std_abbr.field_2;
  local_e0.std_abbr._M_string_length = 0;
  local_e0.std_abbr.field_2._M_local_buf[0] = '\0';
  local_e0.dst_abbr._M_dataplus._M_p = (pointer)&local_e0.dst_abbr.field_2;
  local_e0.dst_abbr._M_string_length = 0;
  local_e0.dst_abbr.field_2._M_local_buf[0] = '\0';
  bVar24 = ParsePosixSpec(&this->future_spec_,&local_e0);
  if ((bVar24) &&
     (bVar24 = GetTransitionType(this,local_e0.std_offset,false,&local_e0.std_abbr,&local_12e),
     bVar24)) {
    if (local_e0.dst_abbr._M_string_length != 0) {
      uVar25 = GetTransitionType(this,local_e0.dst_offset,true,&local_e0.dst_abbr,&local_12d);
      if ((bool)uVar25) {
        local_128 = (vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
                     *)&this->transitions_;
        ::std::
        vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
        ::reserve((vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                   *)local_128,
                  ((long)(this->transitions_).
                         super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->transitions_).
                         super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                  0x322);
        local_12c = (undefined4)CONCAT71(extraout_var,uVar25);
        this->extended_ = true;
        pTVar3 = (this->transitions_).
                 super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_120 = pTVar3[-1].unix_time;
        LocalTime((absolute_lookup *)&local_110,this,local_120,
                  (TransitionType *)
                  ((long)&((this->transition_types_).
                           super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                           ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
                  (ulong)((uint)pTVar3[-1].type_index * 0x30)));
        this->last_year_ = local_110.unix_time;
        bVar24 = false;
        if ((local_110.unix_time & 3U) == 0) {
          lVar26 = local_110.unix_time * -0x70a3d70a3d70a3d7;
          bVar24 = true;
          if ((lVar26 + 0x51eb851eb851eb8U >> 2 | lVar26 << 0x3e) < 0x28f5c28f5c28f5d) {
            bVar24 = (lVar26 + 0x51eb851eb851eb0U >> 4 | lVar26 << 0x3c) < 0xa3d70a3d70a3d7;
          }
        }
        dVar27 = detail::difference((detail *)local_110.unix_time,0x101,0x7b2,0x101);
        uVar31 = local_110.unix_time % 400 + 0x95f;
        uVar32 = uVar31 >> 2;
        lVar26 = dVar27 * 0x3c;
        uVar31 = (uVar31 / 400 + (local_110.unix_time % 400 - uVar32 / 0x19) + uVar32 + 0x960) % 7;
        jan1_weekday = *(int *)(&DAT_00170618 + (uint)((int)uVar31 * 4)) + 1;
        if (uVar31 == 0) {
          jan1_weekday = 0;
        }
        local_110.unix_time = 0;
        local_110.type_index = local_12d;
        local_110.civil_sec.f_.y = 0x7b2;
        local_110.civil_sec.f_.m = '\x01';
        local_110.civil_sec.f_.d = '\x01';
        local_110.civil_sec.f_.hh = '\0';
        local_110.civil_sec.f_.mm = '\0';
        local_110.civil_sec.f_.ss = '\0';
        local_110.prev_civil_sec.f_.y = 0x7b2;
        local_110.prev_civil_sec.f_.m = '\x01';
        local_110.prev_civil_sec.f_.d = '\x01';
        local_110.prev_civil_sec.f_.hh = '\0';
        local_110.prev_civil_sec.f_.mm = '\0';
        local_110.prev_civil_sec.f_.ss = '\0';
        local_60.unix_time = 0;
        local_60.type_index = local_12e;
        local_60.civil_sec.f_.y = 0x7b2;
        local_60.civil_sec.f_.m = '\x01';
        local_60.civil_sec.f_.d = '\x01';
        local_60.civil_sec.f_.hh = '\0';
        local_60.civil_sec.f_.mm = '\0';
        local_60.civil_sec.f_.ss = '\0';
        local_60.prev_civil_sec.f_.y = 0x7b2;
        local_60.prev_civil_sec.f_.m = '\x01';
        local_60.prev_civil_sec.f_.d = '\x01';
        local_60.prev_civil_sec.f_.hh = '\0';
        local_60.prev_civil_sec.f_.mm = '\0';
        local_60.prev_civil_sec.f_.ss = '\0';
        local_118 = this->last_year_ + 400;
        while( true ) {
          iVar28 = anon_unknown_0::TransOffset(bVar24,jan1_weekday,&local_e0.dst_start);
          iVar29 = anon_unknown_0::TransOffset(bVar24,jan1_weekday,&local_e0.dst_end);
          lVar23 = local_118;
          local_110.unix_time = (iVar28 + lVar26) - local_e0.std_offset;
          local_60.unix_time = (iVar29 + lVar26) - local_e0.dst_offset;
          __args = &local_110;
          __args_00 = &local_60;
          if (local_60.unix_time <= local_110.unix_time) {
            __args = &local_60;
            __args_00 = &local_110;
          }
          if (local_120 < __args_00->unix_time) {
            if (local_120 < __args->unix_time) {
              iVar4._M_current =
                   (this->transitions_).
                   super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->transitions_).
                  super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::
                vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
                ::_M_realloc_insert<absl::time_internal::cctz::Transition_const&>
                          (local_128,iVar4,__args);
              }
              else {
                iVar7 = __args->unix_time;
                uVar21 = __args->type_index;
                uVar22 = *(undefined7 *)&__args->field_0x9;
                iVar8 = (__args->civil_sec).f_.y;
                iVar15 = (__args->civil_sec).f_.m;
                iVar16 = (__args->civil_sec).f_.d;
                iVar17 = (__args->civil_sec).f_.hh;
                iVar18 = (__args->civil_sec).f_.mm;
                iVar19 = (__args->civil_sec).f_.ss;
                uVar20 = *(undefined3 *)&(__args->civil_sec).f_.field_0xd;
                iVar9 = (__args->prev_civil_sec).f_.m;
                iVar10 = (__args->prev_civil_sec).f_.d;
                iVar11 = (__args->prev_civil_sec).f_.hh;
                iVar12 = (__args->prev_civil_sec).f_.mm;
                iVar13 = (__args->prev_civil_sec).f_.ss;
                uVar14 = *(undefined3 *)&(__args->prev_civil_sec).f_.field_0xd;
                ((iVar4._M_current)->prev_civil_sec).f_.y = (__args->prev_civil_sec).f_.y;
                ((iVar4._M_current)->prev_civil_sec).f_.m = iVar9;
                ((iVar4._M_current)->prev_civil_sec).f_.d = iVar10;
                ((iVar4._M_current)->prev_civil_sec).f_.hh = iVar11;
                ((iVar4._M_current)->prev_civil_sec).f_.mm = iVar12;
                ((iVar4._M_current)->prev_civil_sec).f_.ss = iVar13;
                *(undefined3 *)&((iVar4._M_current)->prev_civil_sec).f_.field_0xd = uVar14;
                ((iVar4._M_current)->civil_sec).f_.y = iVar8;
                ((iVar4._M_current)->civil_sec).f_.m = iVar15;
                ((iVar4._M_current)->civil_sec).f_.d = iVar16;
                ((iVar4._M_current)->civil_sec).f_.hh = iVar17;
                ((iVar4._M_current)->civil_sec).f_.mm = iVar18;
                ((iVar4._M_current)->civil_sec).f_.ss = iVar19;
                *(undefined3 *)&((iVar4._M_current)->civil_sec).f_.field_0xd = uVar20;
                (iVar4._M_current)->unix_time = iVar7;
                (iVar4._M_current)->type_index = uVar21;
                *(undefined7 *)&(iVar4._M_current)->field_0x9 = uVar22;
                ppTVar1 = &(this->transitions_).
                           super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
            }
            iVar4._M_current =
                 (this->transitions_).
                 super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->transitions_).
                super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
              ::_M_realloc_insert<absl::time_internal::cctz::Transition_const&>
                        (local_128,iVar4,__args_00);
            }
            else {
              iVar7 = __args_00->unix_time;
              uVar21 = __args_00->type_index;
              uVar22 = *(undefined7 *)&__args_00->field_0x9;
              iVar8 = (__args_00->civil_sec).f_.y;
              iVar15 = (__args_00->civil_sec).f_.m;
              iVar16 = (__args_00->civil_sec).f_.d;
              iVar17 = (__args_00->civil_sec).f_.hh;
              iVar18 = (__args_00->civil_sec).f_.mm;
              iVar19 = (__args_00->civil_sec).f_.ss;
              uVar20 = *(undefined3 *)&(__args_00->civil_sec).f_.field_0xd;
              iVar9 = (__args_00->prev_civil_sec).f_.m;
              iVar10 = (__args_00->prev_civil_sec).f_.d;
              iVar11 = (__args_00->prev_civil_sec).f_.hh;
              iVar12 = (__args_00->prev_civil_sec).f_.mm;
              iVar13 = (__args_00->prev_civil_sec).f_.ss;
              uVar14 = *(undefined3 *)&(__args_00->prev_civil_sec).f_.field_0xd;
              ((iVar4._M_current)->prev_civil_sec).f_.y = (__args_00->prev_civil_sec).f_.y;
              ((iVar4._M_current)->prev_civil_sec).f_.m = iVar9;
              ((iVar4._M_current)->prev_civil_sec).f_.d = iVar10;
              ((iVar4._M_current)->prev_civil_sec).f_.hh = iVar11;
              ((iVar4._M_current)->prev_civil_sec).f_.mm = iVar12;
              ((iVar4._M_current)->prev_civil_sec).f_.ss = iVar13;
              *(undefined3 *)&((iVar4._M_current)->prev_civil_sec).f_.field_0xd = uVar14;
              ((iVar4._M_current)->civil_sec).f_.y = iVar8;
              ((iVar4._M_current)->civil_sec).f_.m = iVar15;
              ((iVar4._M_current)->civil_sec).f_.d = iVar16;
              ((iVar4._M_current)->civil_sec).f_.hh = iVar17;
              ((iVar4._M_current)->civil_sec).f_.mm = iVar18;
              ((iVar4._M_current)->civil_sec).f_.ss = iVar19;
              *(undefined3 *)&((iVar4._M_current)->civil_sec).f_.field_0xd = uVar20;
              (iVar4._M_current)->unix_time = iVar7;
              (iVar4._M_current)->type_index = uVar21;
              *(undefined7 *)&(iVar4._M_current)->field_0x9 = uVar22;
              ppTVar1 = &(this->transitions_).
                         super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
          }
          lVar5 = this->last_year_;
          if (lVar5 != lVar23) {
            lVar26 = lVar26 + *(int *)((long)&(anonymous_namespace)::kSecsPerYear +
                                      (ulong)((uint)bVar24 * 4));
            jan1_weekday = (jan1_weekday +
                           *(int *)((long)&(anonymous_namespace)::kDaysPerYear +
                                   (ulong)((uint)bVar24 * 4))) % 7;
            if ((bVar24 == false) && ((lVar5 + 1U & 3) == 0)) {
              lVar30 = (lVar5 + 1U) * -0x70a3d70a3d70a3d7;
              bVar24 = true;
              if ((lVar30 + 0x51eb851eb851eb8U >> 2 | lVar30 << 0x3e) < 0x28f5c28f5c28f5d) {
                bVar24 = (lVar30 + 0x51eb851eb851eb0U >> 4 | lVar30 << 0x3c) < 0xa3d70a3d70a3d7;
              }
            }
            else {
              bVar24 = false;
            }
          }
          if (lVar5 == lVar23) break;
          this->last_year_ = lVar5 + 1;
        }
        uVar25 = (undefined1)local_12c;
      }
      goto LAB_0015adb3;
    }
    bVar2 = (this->transitions_).
            super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].type_index;
    uVar25 = 1;
    if (bVar2 == local_12e) goto LAB_0015adb3;
    pTVar6 = (this->transition_types_).
             super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar31 = (ulong)((uint)bVar2 * 0x30);
    uVar32 = (ulong)((uint)local_12e * 0x30);
    if (*(int *)((long)&pTVar6->utc_offset + uVar31) == *(int *)((long)&pTVar6->utc_offset + uVar32)
       ) {
      if ((&pTVar6->is_dst)[uVar31] == (&pTVar6->is_dst)[uVar32]) {
        uVar25 = (&pTVar6->abbr_index)[uVar31] == (&pTVar6->abbr_index)[uVar32];
        goto LAB_0015adb3;
      }
    }
  }
  uVar25 = 0;
LAB_0015adb3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.dst_abbr._M_dataplus._M_p != &local_e0.dst_abbr.field_2) {
    operator_delete(local_e0.dst_abbr._M_dataplus._M_p,
                    CONCAT71(local_e0.dst_abbr.field_2._M_allocated_capacity._1_7_,
                             local_e0.dst_abbr.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.std_abbr._M_dataplus._M_p != &local_e0.std_abbr.field_2) {
    operator_delete(local_e0.std_abbr._M_dataplus._M_p,
                    CONCAT71(local_e0.std_abbr.field_2._M_allocated_capacity._1_7_,
                             local_e0.std_abbr.field_2._M_local_buf[0]) + 1);
  }
  return (bool)uVar25;
}

Assistant:

bool TimeZoneInfo::ExtendTransitions() {
  extended_ = false;
  if (future_spec_.empty()) return true;  // last transition prevails

  PosixTimeZone posix;
  if (!ParsePosixSpec(future_spec_, &posix)) return false;

  // Find transition type for the future std specification.
  std::uint_least8_t std_ti;
  if (!GetTransitionType(posix.std_offset, false, posix.std_abbr, &std_ti))
    return false;

  if (posix.dst_abbr.empty()) {  // std only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, std_ti);
  }

  // Find transition type for the future dst specification.
  std::uint_least8_t dst_ti;
  if (!GetTransitionType(posix.dst_offset, true, posix.dst_abbr, &dst_ti))
    return false;

  // Extend the transitions for an additional 400 years using the
  // future specification. Years beyond those can be handled by
  // mapping back to a cycle-equivalent year within that range.
  // We may need two additional transitions for the current year.
  transitions_.reserve(transitions_.size() + 400 * 2 + 2);
  extended_ = true;

  const Transition& last(transitions_.back());
  const std::int_fast64_t last_time = last.unix_time;
  const TransitionType& last_tt(transition_types_[last.type_index]);
  last_year_ = LocalTime(last_time, last_tt).cs.year();
  bool leap_year = IsLeap(last_year_);
  const civil_second jan1(last_year_);
  std::int_fast64_t jan1_time = jan1 - civil_second();
  int jan1_weekday = ToPosixWeekday(get_weekday(jan1));

  Transition dst = {0, dst_ti, civil_second(), civil_second()};
  Transition std = {0, std_ti, civil_second(), civil_second()};
  for (const year_t limit = last_year_ + 400;; ++last_year_) {
    auto dst_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_start);
    auto std_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_end);
    dst.unix_time = jan1_time + dst_trans_off - posix.std_offset;
    std.unix_time = jan1_time + std_trans_off - posix.dst_offset;
    const auto* ta = dst.unix_time < std.unix_time ? &dst : &std;
    const auto* tb = dst.unix_time < std.unix_time ? &std : &dst;
    if (last_time < tb->unix_time) {
      if (last_time < ta->unix_time) transitions_.push_back(*ta);
      transitions_.push_back(*tb);
    }
    if (last_year_ == limit) break;
    jan1_time += kSecsPerYear[leap_year];
    jan1_weekday = (jan1_weekday + kDaysPerYear[leap_year]) % 7;
    leap_year = !leap_year && IsLeap(last_year_ + 1);
  }

  return true;
}